

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenExpressionRef
BinaryenMemoryInit(BinaryenModuleRef module,char *segment,BinaryenExpressionRef dest,
                  BinaryenExpressionRef offset,BinaryenExpressionRef size,char *memoryName)

{
  IString *this;
  MemoryInit *this_00;
  undefined1 reuse;
  string_view sVar1;
  string_view sVar2;
  
  reuse = SUB81(offset,0);
  this = (IString *)strlen(segment);
  sVar1._M_str = (char *)0x0;
  sVar1._M_len = (size_t)segment;
  sVar1 = wasm::IString::interned(this,sVar1,(bool)reuse);
  sVar2 = (string_view)getMemoryName(module,memoryName);
  this_00 = (MemoryInit *)MixedArena::allocSpace(&module->allocator,0x48,8);
  *(undefined8 *)&(this_00->super_SpecificExpression<(wasm::Expression::Id)36>).super_Expression = 0
  ;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)36>).super_Expression.type.id = 0;
  (this_00->segment).super_IString.str._M_len = 0;
  (this_00->segment).super_IString.str._M_str = (char *)0x0;
  this_00->dest = (Expression *)0x0;
  this_00->offset = (Expression *)0x0;
  this_00->size = (Expression *)0x0;
  (this_00->memory).super_IString.str._M_len = 0;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)36>).super_Expression._id = MemoryInitId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)36>).super_Expression.type.id = 0;
  (this_00->segment).super_IString.str._M_len = 0;
  (this_00->segment).super_IString.str = sVar1;
  this_00->dest = dest;
  this_00->offset = offset;
  this_00->size = size;
  (this_00->memory).super_IString.str = sVar2;
  wasm::MemoryInit::finalize(this_00);
  return (BinaryenExpressionRef)this_00;
}

Assistant:

BinaryenExpressionRef BinaryenMemoryInit(BinaryenModuleRef module,
                                         const char* segment,
                                         BinaryenExpressionRef dest,
                                         BinaryenExpressionRef offset,
                                         BinaryenExpressionRef size,
                                         const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeMemoryInit(Name(segment),
                      (Expression*)dest,
                      (Expression*)offset,
                      (Expression*)size,
                      getMemoryName(module, memoryName)));
}